

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_stop(ma_device *pDevice)

{
  ma_uint32 mVar1;
  ma_bool32 mVar2;
  ma_result local_44;
  ma_result result;
  ma_device *pDevice_local;
  
  if (pDevice == (ma_device *)0x0) {
    pDevice_local._0_4_ =
         ma_post_error((ma_device *)0x0,1,
                       "ma_device_stop() called with invalid arguments (pDevice == NULL).",-2);
  }
  else {
    mVar1 = ma_device_get_state(pDevice);
    if (mVar1 == 0) {
      pDevice_local._0_4_ =
           ma_post_error(pDevice,1,"ma_device_stop() called for an uninitialized device.",-200);
    }
    else {
      mVar1 = ma_device_get_state(pDevice);
      if (mVar1 == 1) {
        pDevice_local._0_4_ =
             ma_post_error(pDevice,2,"ma_device_stop() called when the device is already stopped.",
                           -3);
      }
      else {
        ma_mutex_lock(&pDevice->startStopLock);
        mVar1 = ma_device_get_state(pDevice);
        if (mVar1 != 2) {
          __assert_fail("ma_device_get_state(pDevice) == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                        ,0x8344,"ma_result ma_device_stop(ma_device *)");
        }
        LOCK();
        pDevice->state = 4;
        UNLOCK();
        mVar2 = ma_context_is_backend_asynchronous(pDevice->pContext);
        if (mVar2 == 0) {
          mVar1 = ma_device_get_state(pDevice);
          if (mVar1 == 2) {
            __assert_fail("ma_device_get_state(pDevice) != 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                          ,0x8359,"ma_result ma_device_stop(ma_device *)");
          }
          if ((pDevice->pContext->callbacks).onDeviceDataLoopWakeup !=
              (_func_ma_result_ma_device_ptr *)0x0) {
            (*(pDevice->pContext->callbacks).onDeviceDataLoopWakeup)(pDevice);
          }
          ma_event_wait(&pDevice->stopEvent);
          local_44 = 0;
        }
        else {
          if ((pDevice->pContext->callbacks).onDeviceStop == (_func_ma_result_ma_device_ptr *)0x0) {
            local_44 = -3;
          }
          else {
            local_44 = (*(pDevice->pContext->callbacks).onDeviceStop)(pDevice);
          }
          LOCK();
          pDevice->state = 1;
          UNLOCK();
        }
        ma_mutex_unlock(&pDevice->startStopLock);
        pDevice_local._0_4_ = local_44;
      }
    }
  }
  return (ma_result)pDevice_local;
}

Assistant:

MA_API ma_result ma_device_stop(ma_device* pDevice)
{
    ma_result result;

    if (pDevice == NULL) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "ma_device_stop() called with invalid arguments (pDevice == NULL).", MA_INVALID_ARGS);
    }

    if (ma_device_get_state(pDevice) == MA_STATE_UNINITIALIZED) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "ma_device_stop() called for an uninitialized device.", MA_DEVICE_NOT_INITIALIZED);
    }

    if (ma_device_get_state(pDevice) == MA_STATE_STOPPED) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_WARNING, "ma_device_stop() called when the device is already stopped.", MA_INVALID_OPERATION);   /* Already stopped. Returning an error to let the application know because it probably means they're doing something wrong. */
    }

    ma_mutex_lock(&pDevice->startStopLock);
    {
        /* Starting and stopping are wrapped in a mutex which means we can assert that the device is in a started or paused state. */
        MA_ASSERT(ma_device_get_state(pDevice) == MA_STATE_STARTED);

        ma_device__set_state(pDevice, MA_STATE_STOPPING);

        /* Asynchronous backends need to be handled differently. */
        if (ma_context_is_backend_asynchronous(pDevice->pContext)) {
            /* Asynchronous backends must have a stop operation. */
            if (pDevice->pContext->callbacks.onDeviceStop != NULL) {
                result = pDevice->pContext->callbacks.onDeviceStop(pDevice);
            } else {
                result = MA_INVALID_OPERATION;
            }

            ma_device__set_state(pDevice, MA_STATE_STOPPED);
        } else {
            /*
            Synchronous backends. The stop callback is always called from the worker thread. Do not call the stop callback here. If
            the backend is implementing it's own audio thread loop we'll need to wake it up if required. Note that we need to make
            sure the state of the device is *not* playing right now, which it shouldn't be since we set it above. This is super
            important though, so I'm asserting it here as well for extra safety in case we accidentally change something later.
            */
            MA_ASSERT(ma_device_get_state(pDevice) != MA_STATE_STARTED);

            if (pDevice->pContext->callbacks.onDeviceDataLoopWakeup != NULL) {
                pDevice->pContext->callbacks.onDeviceDataLoopWakeup(pDevice);
            }

            /*
            We need to wait for the worker thread to become available for work before returning. Note that the worker thread will be
            the one who puts the device into the stopped state. Don't call ma_device__set_state() here.
            */
            ma_event_wait(&pDevice->stopEvent);
            result = MA_SUCCESS;
        }
    }
    ma_mutex_unlock(&pDevice->startStopLock);

    return result;
}